

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularMessage::GenerateMessageClearingCode
          (SingularMessage *this,Printer *p)

{
  LogMessageFatal aLStack_18 [16];
  
  if (this->has_hasbit_ != false) {
    io::Printer::Emit(p,0x47,
                      "\n        $DCHK$($field_$ != nullptr);\n        $field_$->Clear();\n      ");
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/field_generators/message_field.cc"
             ,0x142,0xb,"has_hasbit_");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
}

Assistant:

void SingularMessage::GenerateMessageClearingCode(io::Printer* p) const {
  ABSL_CHECK(has_hasbit_);
  p->Emit(
      R"cc(
        $DCHK$($field_$ != nullptr);
        $field_$->Clear();
      )cc");
}